

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotLineEx<ImPlot::GetterYs<signed_char>>(char *label_id,GetterYs<signed_char> *getter)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar6;
  char *pcVar7;
  ImPlotRange *pIVar8;
  ImPlotContext *pIVar9;
  bool bVar10;
  uint uVar11;
  ImU32 col;
  long lVar12;
  double dVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  GetterYs<signed_char> *pGVar19;
  double dVar20;
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  char *pcVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  GetterYs<signed_char> *local_98;
  long local_90;
  ImU32 local_88;
  ImU32 local_84;
  ImDrawList *local_80;
  uint local_74;
  long local_70;
  ulong local_68;
  double local_60;
  double local_58;
  char *local_50;
  double local_48;
  undefined8 local_40;
  long local_38;
  
  bVar10 = BeginItem(label_id,0);
  pIVar9 = GImPlot;
  if (bVar10) {
    if ((GImPlot->FitThisFrame == true) && (iVar2 = getter->Count, 0 < iVar2)) {
      dVar13 = getter->X0;
      dVar20 = getter->XScale;
      pcVar25 = getter->Ys;
      iVar16 = getter->Offset;
      iVar15 = getter->Stride;
      pIVar6 = GImPlot->CurrentPlot;
      iVar3 = pIVar6->CurrentYAxis;
      uVar4 = (pIVar6->XAxis).Flags;
      pIVar8 = GImPlot->ExtentsY;
      uVar5 = pIVar6->YAxis[iVar3].Flags;
      iVar17 = 0;
      uVar14 = uVar5 & 0x20;
      uVar11 = uVar14 >> 5;
      local_90 = CONCAT44(local_90._4_4_,uVar11);
      lVar12 = local_90;
      local_40 = (ImPlotContext *)(CONCAT44(local_40._4_4_,uVar4) & 0xffffffff00000020);
      dVar24 = 0.0;
      do {
        dVar27 = dVar20 * dVar24 + dVar13;
        cVar1 = pcVar25[(long)(((iVar16 + iVar17) % iVar2 + iVar2) % iVar2) * (long)iVar15];
        dVar26 = (double)(int)cVar1;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar27) < 0x7ff0000000000000) {
LAB_001c3d66:
            if ((0.0 < dVar27) || ((int)local_40 == 0)) {
              dVar28 = (pIVar9->ExtentsX).Min;
              dVar29 = dVar27;
              if (dVar28 <= dVar27) {
                dVar29 = dVar28;
              }
              (pIVar9->ExtentsX).Min = dVar29;
              dVar28 = (pIVar9->ExtentsX).Max;
              dVar29 = dVar27;
              if (dVar27 <= dVar28) {
                dVar29 = dVar28;
              }
              (pIVar9->ExtentsX).Max = dVar29;
            }
          }
        }
        else if ((((long)ABS(dVar27) < 0x7ff0000000000000) &&
                 (pIVar6->YAxis[iVar3].Range.Min <= dVar26)) &&
                (dVar26 <= pIVar6->YAxis[iVar3].Range.Max)) goto LAB_001c3d66;
        if ((uVar5 >> 10 & 1) == 0) {
          if (('\0' < cVar1) || (uVar14 == 0)) {
LAB_001c3dd2:
            dVar27 = pIVar8[iVar3].Min;
            dVar28 = dVar26;
            if (dVar27 <= dVar26) {
              dVar28 = dVar27;
            }
            pIVar8[iVar3].Min = dVar28;
            dVar27 = pIVar9->ExtentsY[iVar3].Max;
            if (dVar26 <= dVar27) {
              dVar26 = dVar27;
            }
            pIVar9->ExtentsY[iVar3].Max = dVar26;
          }
        }
        else if ((((pIVar6->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar6->XAxis).Range.Max)) &&
                (local_90._0_1_ = (byte)uVar11, (cVar1 < '\x01' & (byte)local_90) == 0))
        goto LAB_001c3dd2;
        dVar24 = dVar24 + 1.0;
        iVar17 = iVar17 + 1;
        local_90 = lVar12;
      } while (iVar2 != iVar17);
    }
    local_98 = getter;
    local_80 = GetPlotDrawList();
    pGVar19 = local_98;
    if ((1 < local_98->Count) && ((pIVar9->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar9->NextItemData).Colors);
      iVar2 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar2]) {
      case 0:
        local_a8 = CONCAT44(local_a8._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLinLin>
                  (pGVar19,(TransformerLinLin *)&local_a8,local_80,(pIVar9->NextItemData).LineWeight
                   ,col);
        break;
      case 1:
        local_a8 = CONCAT44(local_a8._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLogLin>
                  (pGVar19,(TransformerLogLin *)&local_a8,local_80,(pIVar9->NextItemData).LineWeight
                   ,col);
        break;
      case 2:
        local_a8 = CONCAT44(local_a8._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLinLog>
                  (pGVar19,(TransformerLinLog *)&local_a8,local_80,(pIVar9->NextItemData).LineWeight
                   ,col);
        break;
      case 3:
        local_a8 = CONCAT44(local_a8._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterYs<signed_char>,ImPlot::TransformerLogLog>
                  (pGVar19,(TransformerLogLog *)&local_a8,local_80,(pIVar9->NextItemData).LineWeight
                   ,col);
      }
    }
    if ((pIVar9->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar9->NextItemData).MarkerSize);
      local_84 = ImGui::GetColorU32((pIVar9->NextItemData).Colors + 2);
      local_88 = ImGui::GetColorU32((pIVar9->NextItemData).Colors + 3);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      lVar12 = (long)transformer.YAxis;
      local_40 = GImPlot;
      local_90 = lVar12;
      switch(GImPlot->Scales[lVar12]) {
      case 0:
        iVar2 = pGVar19->Count;
        if (0 < iVar2) {
          pcVar7 = pGVar19->Ys;
          local_48 = pGVar19->XScale;
          uVar22 = SUB84(local_48,0);
          uVar23 = (undefined4)((ulong)local_48 >> 0x20);
          pcVar25 = (char *)pGVar19->X0;
          dVar13 = (double)(ulong)(uint)pGVar19->Offset;
          local_60 = (double)CONCAT44(local_60._4_4_,(pIVar9->NextItemData).MarkerSize);
          local_68 = CONCAT44(local_68._4_4_,(pIVar9->NextItemData).MarkerWeight);
          local_70 = (long)(pIVar9->NextItemData).Marker;
          iVar16 = pGVar19->Stride;
          iVar15 = 0;
          pGVar19 = (GetterYs<signed_char> *)0x0;
          local_9c = (float)(uint)(pIVar9->NextItemData).RenderMarkerLine;
          local_a0 = (float)(uint)(pIVar9->NextItemData).RenderMarkerFill;
          local_58 = dVar13;
          local_50 = pcVar25;
          do {
            fVar18 = (float)((((double)CONCAT44(uVar23,uVar22) * (double)pGVar19 + (double)pcVar25)
                             - (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[lVar12].Min.x);
            fVar21 = (float)(((double)(int)pcVar7[(long)(((SUB84(dVar13,0) + iVar15) % iVar2 + iVar2
                                                         ) % iVar2) * (long)iVar16] -
                             GImPlot->CurrentPlot->YAxis[lVar12].Range.Min) * GImPlot->My[local_90]
                            + (double)GImPlot->PixelRange[lVar12].Min.y);
            local_a8 = CONCAT44(fVar21,fVar18);
            pIVar6 = local_40->CurrentPlot;
            if ((((pIVar6->PlotRect).Min.x <= fVar18) && ((pIVar6->PlotRect).Min.y <= fVar21)) &&
               ((fVar18 < (pIVar6->PlotRect).Max.x && (fVar21 < (pIVar6->PlotRect).Max.y)))) {
              local_98 = pGVar19;
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<signed_char>>(ImPlot::GetterYs<signed>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_70 * 8))
                        ((ulong)local_60 & 0xffffffff,local_68 & 0xffffffff,local_80,&local_a8,
                         local_9c,local_84,local_a0,local_88);
              uVar22 = SUB84(local_48,0);
              uVar23 = (undefined4)((ulong)local_48 >> 0x20);
              dVar13 = local_58;
              pcVar25 = local_50;
              pGVar19 = local_98;
            }
            pGVar19 = (GetterYs<signed_char> *)((double)pGVar19 + 1.0);
            iVar15 = iVar15 + 1;
          } while (iVar2 != iVar15);
        }
        break;
      case 1:
        iVar2 = pGVar19->Count;
        if (0 < iVar2) {
          local_50 = pGVar19->Ys;
          local_58 = pGVar19->XScale;
          local_60 = pGVar19->X0;
          local_68 = (ulong)(uint)pGVar19->Offset;
          local_9c = (pIVar9->NextItemData).MarkerSize;
          local_a0 = (pIVar9->NextItemData).MarkerWeight;
          local_38 = (long)(pIVar9->NextItemData).Marker;
          local_70 = (long)pGVar19->Stride;
          iVar16 = 0;
          pGVar19 = (GetterYs<signed_char> *)0x0;
          local_74 = (uint)(pIVar9->NextItemData).RenderMarkerLine;
          bVar10 = (pIVar9->NextItemData).RenderMarkerFill;
          do {
            pIVar9 = GImPlot;
            local_48 = (double)(int)local_50[((((int)local_68 + iVar16) % iVar2 + iVar2) % iVar2) *
                                             local_70];
            local_98 = pGVar19;
            dVar20 = log10((local_58 * (double)pGVar19 + local_60) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar6 = pIVar9->CurrentPlot;
            dVar13 = (pIVar6->XAxis).Range.Min;
            fVar18 = (float)((((double)(float)(dVar20 / pIVar9->LogDenX) *
                               ((pIVar6->XAxis).Range.Max - dVar13) + dVar13) - dVar13) * pIVar9->Mx
                            + (double)pIVar9->PixelRange[lVar12].Min.x);
            fVar21 = (float)((local_48 - pIVar6->YAxis[lVar12].Range.Min) * pIVar9->My[local_90] +
                            (double)pIVar9->PixelRange[lVar12].Min.y);
            local_a8 = CONCAT44(fVar21,fVar18);
            pIVar6 = local_40->CurrentPlot;
            if ((((pIVar6->PlotRect).Min.x <= fVar18) && ((pIVar6->PlotRect).Min.y <= fVar21)) &&
               ((fVar18 < (pIVar6->PlotRect).Max.x && (fVar21 < (pIVar6->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<signed_char>>(ImPlot::GetterYs<signed>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_38 * 8))
                        (local_9c,local_a0,local_80,&local_a8,local_74,local_84,bVar10,local_88);
            }
            pGVar19 = (GetterYs<signed_char> *)((double)local_98 + 1.0);
            iVar16 = iVar16 + 1;
          } while (iVar2 != iVar16);
        }
        break;
      case 2:
        iVar2 = pGVar19->Count;
        if (0 < iVar2) {
          local_50 = pGVar19->Ys;
          local_58 = pGVar19->XScale;
          local_60 = pGVar19->X0;
          local_68 = (ulong)(uint)pGVar19->Offset;
          local_9c = (pIVar9->NextItemData).MarkerSize;
          local_a0 = (pIVar9->NextItemData).MarkerWeight;
          local_38 = (long)(pIVar9->NextItemData).Marker;
          local_70 = (long)pGVar19->Stride;
          iVar16 = 0;
          pGVar19 = (GetterYs<signed_char> *)0x0;
          local_74 = (uint)(pIVar9->NextItemData).RenderMarkerLine;
          bVar10 = (pIVar9->NextItemData).RenderMarkerFill;
          do {
            pIVar9 = GImPlot;
            local_48 = local_58 * (double)pGVar19 + local_60;
            local_98 = pGVar19;
            dVar20 = log10((double)(int)local_50[((((int)local_68 + iVar16) % iVar2 + iVar2) % iVar2
                                                 ) * local_70] /
                           GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
            pIVar6 = pIVar9->CurrentPlot;
            dVar13 = pIVar6->YAxis[lVar12].Range.Min;
            fVar21 = (float)((local_48 - (pIVar6->XAxis).Range.Min) * pIVar9->Mx +
                            (double)pIVar9->PixelRange[lVar12].Min.x);
            fVar18 = (float)((((double)(float)(dVar20 / pIVar9->LogDenY[local_90]) *
                               (pIVar6->YAxis[lVar12].Range.Max - dVar13) + dVar13) - dVar13) *
                             pIVar9->My[local_90] + (double)pIVar9->PixelRange[lVar12].Min.y);
            local_a8 = CONCAT44(fVar18,fVar21);
            pIVar6 = local_40->CurrentPlot;
            if (((((pIVar6->PlotRect).Min.x <= fVar21) && ((pIVar6->PlotRect).Min.y <= fVar18)) &&
                (fVar21 < (pIVar6->PlotRect).Max.x)) && (fVar18 < (pIVar6->PlotRect).Max.y)) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<signed_char>>(ImPlot::GetterYs<signed>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_38 * 8))
                        (local_9c,local_a0,local_80,&local_a8,local_74,local_84,bVar10,local_88);
            }
            pGVar19 = (GetterYs<signed_char> *)((double)local_98 + 1.0);
            iVar16 = iVar16 + 1;
          } while (iVar2 != iVar16);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<signed_char>>
                  (*pGVar19,transformer,local_80,(pIVar9->NextItemData).Marker,
                   (pIVar9->NextItemData).MarkerSize,(pIVar9->NextItemData).RenderMarkerLine,
                   local_84,(pIVar9->NextItemData).MarkerWeight,
                   (pIVar9->NextItemData).RenderMarkerFill,local_88);
      }
    }
    pIVar9 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar9->NextItemData);
    pIVar9->PreviousItem = pIVar9->CurrentItem;
    pIVar9->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotLineEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineStrip(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineStrip(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineStrip(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineStrip(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}